

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_checkScalingFactorBothNonBaseUnitsImported_Test::TestBody
          (Units_checkScalingFactorBothNonBaseUnitsImported_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  char *pcVar6;
  AssertHelper local_320 [8];
  Message local_318 [8];
  double local_310;
  double local_308;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_1;
  Message local_2e8 [8];
  double local_2e0;
  double local_2d8;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_2a0 [8];
  Message local_298 [15];
  bool local_289;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_;
  string local_270 [32];
  undefined1 local_250 [8];
  ImportSourcePtr import;
  string local_238 [39];
  allocator<char> local_211;
  string local_210 [39];
  allocator<char> local_1e9;
  string local_1e8 [39];
  allocator<char> local_1c1;
  string local_1c0 [32];
  undefined1 local_1a0 [8];
  UnitsPtr u2;
  string local_188 [39];
  allocator<char> local_161;
  string local_160 [39];
  allocator<char> local_139;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [32];
  undefined1 local_f0 [8];
  UnitsPtr u1;
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [39];
  allocator<char> local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  UnitsPtr u;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  ModelPtr model;
  Units_checkScalingFactorBothNonBaseUnitsImported_Test *this_local;
  
  model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  libcellml::Model::create();
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"model",&local_41);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  libcellml::Units::create();
  peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,"u",&local_89);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"apples",&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,"",
             (allocator<char> *)
             ((long)&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar4,(int)local_b0,1.0,1.0,(string *)0x0);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  libcellml::Units::create();
  peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_110,"u1",&local_111);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_138,"",&local_139);
  libcellml::Units::addUnit((StandardUnit)peVar4,0,1.0,1.0,(string *)0x0);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_139);
  peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_160,"u",&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_188,"",
             (allocator<char> *)
             ((long)&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar4,(int)local_160,1.0,1.0,(string *)0x0);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator(&local_161);
  libcellml::Units::create();
  peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,"u2",&local_1c1);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"",&local_1e9);
  libcellml::Units::addUnit((StandardUnit)peVar4,0x16,1.0,1.0,(string *)0x0);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_210,"u",&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_238,"",
             (allocator<char> *)
             ((long)&import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar4,(int)local_210,1.0,1.0,(string *)0x0);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator(&local_211);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  libcellml::Model::addUnits((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  libcellml::Model::addUnits((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  libcellml::Model::addUnits((shared_ptr *)peVar3);
  libcellml::ImportSource::create();
  peVar5 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_250);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_270,"I_am_a_url",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::ImportSource::setUrl((string *)peVar5);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_68);
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(peVar4 + 0x10));
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_68);
  bVar1 = libcellml::ImportedEntity::isImport();
  local_289 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_288,&local_289,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar2) {
    testing::Message::Message(local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar.message_,local_288,"u->isImport()","false");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x5d4,pcVar6);
    testing::internal::AssertHelper::operator=(local_2a0,local_298);
    testing::internal::AssertHelper::~AssertHelper(local_2a0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  local_2d8 = 0.0;
  local_2e0 = (double)libcellml::Units::scalingFactor
                                ((shared_ptr *)local_f0,(shared_ptr *)local_1a0,true);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_2d0,"0.0","libcellml::Units::scalingFactor(u1, u2)",&local_2d8
             ,&local_2e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar2) {
    testing::Message::Message(local_2e8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x5d5,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  local_308 = 0.0;
  local_310 = (double)libcellml::Units::scalingFactor
                                ((shared_ptr *)local_1a0,(shared_ptr *)local_f0,true);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_300,"0.0","libcellml::Units::scalingFactor(u2, u1)",&local_308
             ,&local_310);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar2) {
    testing::Message::Message(local_318);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    testing::internal::AssertHelper::AssertHelper
              (local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x5d6,pcVar6);
    testing::internal::AssertHelper::operator=(local_320,local_318);
    testing::internal::AssertHelper::~AssertHelper(local_320);
    testing::Message::~Message(local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)local_250);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_1a0);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_f0);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_68);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_20);
  return;
}

Assistant:

TEST(Units, checkScalingFactorBothNonBaseUnitsImported)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName("model");

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("u");
    u->addUnit("apples", 0, 1.0, 1.0);

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit(libcellml::Units::StandardUnit::AMPERE, 0, 1.0, 1.0);
    u1->addUnit("u", 0, 1.0, 1.0);

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::RADIAN, 0, 1.0, 1.0);
    u2->addUnit("u", 0, 1.0, 1.0);

    model->addUnits(u);
    model->addUnits(u1);
    model->addUnits(u2);

    libcellml::ImportSourcePtr import = libcellml::ImportSource::create();
    import->setUrl("I_am_a_url");

    u->setImportSource(import);

    EXPECT_TRUE(u->isImport());
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u1, u2));
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u2, u1));
}